

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

bool __thiscall
duckdb::QuantileCompare<duckdb::MadAccessor<short,_short,_short>_>::operator()
          (QuantileCompare<duckdb::MadAccessor<short,_short,_short>_> *this,INPUT_TYPE *lhs,
          INPUT_TYPE *rhs)

{
  RESULT_TYPE_conflict RVar1;
  RESULT_TYPE_conflict RVar2;
  long in_RDI;
  RESULT_TYPE_conflict rval;
  RESULT_TYPE_conflict lval;
  INPUT_TYPE_conflict *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  bool bVar3;
  
  RVar1 = MadAccessor<short,_short,_short>::operator()
                    ((MadAccessor<short,_short,_short> *)
                     CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
  RVar2 = MadAccessor<short,_short,_short>::operator()
                    ((MadAccessor<short,_short,_short> *)
                     CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8);
  if ((*(byte *)(in_RDI + 0x10) & 1) == 0) {
    bVar3 = RVar1 < RVar2;
  }
  else {
    bVar3 = RVar2 < RVar1;
  }
  return bVar3;
}

Assistant:

inline bool operator()(const INPUT_TYPE &lhs, const INPUT_TYPE &rhs) const {
		const auto lval = accessor_l(lhs);
		const auto rval = accessor_r(rhs);

		return desc ? (rval < lval) : (lval < rval);
	}